

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_channel_map_is_equal
                    (ma_channel *pChannelMapA,ma_channel *pChannelMapB,ma_uint32 channels)

{
  byte bVar1;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  ma_uint32 iChannel;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint local_20;
  
  if (in_RDI != in_RSI) {
    for (local_20 = 0; local_20 < in_EDX; local_20 = local_20 + 1) {
      bVar1 = ma_channel_map_get_channel
                        ((ma_channel *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                         ,0,0x22e3bc);
      in_stack_ffffffffffffffdc = (uint)bVar1;
      bVar1 = ma_channel_map_get_channel
                        ((ma_channel *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffd8),0,0x22e3d5);
      if (in_stack_ffffffffffffffdc != bVar1) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

MA_API ma_bool32 ma_channel_map_is_equal(const ma_channel* pChannelMapA, const ma_channel* pChannelMapB, ma_uint32 channels)
{
    ma_uint32 iChannel;

    if (pChannelMapA == pChannelMapB) {
        return MA_TRUE;
    }

    for (iChannel = 0; iChannel < channels; ++iChannel) {
        if (ma_channel_map_get_channel(pChannelMapA, channels, iChannel) != ma_channel_map_get_channel(pChannelMapB, channels, iChannel)) {
            return MA_FALSE;
        }
    }

    return MA_TRUE;
}